

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O2

float * drwav_open_and_read_pcm_frames_f32
                  (drwav_read_proc onRead,drwav_seek_proc onSeek,void *pUserData,uint *channelsOut,
                  uint *sampleRateOut,drwav_uint64 *totalFrameCountOut,
                  drwav_allocation_callbacks *pAllocationCallbacks)

{
  drwav_bool32 dVar1;
  float *pfVar2;
  drwav local_1d0;
  
  if (channelsOut != (uint *)0x0) {
    *channelsOut = 0;
  }
  if (sampleRateOut != (uint *)0x0) {
    *sampleRateOut = 0;
  }
  if (totalFrameCountOut != (drwav_uint64 *)0x0) {
    *totalFrameCountOut = 0;
  }
  dVar1 = drwav_init(&local_1d0,onRead,onSeek,pUserData,pAllocationCallbacks);
  if (dVar1 == 0) {
    pfVar2 = (float *)0x0;
  }
  else {
    pfVar2 = drwav__read_pcm_frames_and_close_f32
                       (&local_1d0,channelsOut,sampleRateOut,totalFrameCountOut);
  }
  return pfVar2;
}

Assistant:

DRWAV_API float* drwav_open_and_read_pcm_frames_f32(drwav_read_proc onRead, drwav_seek_proc onSeek, void* pUserData, unsigned int* channelsOut, unsigned int* sampleRateOut, drwav_uint64* totalFrameCountOut, const drwav_allocation_callbacks* pAllocationCallbacks)
{
    drwav wav;

    if (channelsOut) {
        *channelsOut = 0;
    }
    if (sampleRateOut) {
        *sampleRateOut = 0;
    }
    if (totalFrameCountOut) {
        *totalFrameCountOut = 0;
    }

    if (!drwav_init(&wav, onRead, onSeek, pUserData, pAllocationCallbacks)) {
        return NULL;
    }

    return drwav__read_pcm_frames_and_close_f32(&wav, channelsOut, sampleRateOut, totalFrameCountOut);
}